

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec2 __thiscall tcu::projectToFace(tcu *this,CubeFace face,Vec3 *coord)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Qa [2];
  Vec2 VVar4;
  float t;
  float s;
  float ma;
  float tc;
  float sc;
  float rz;
  float ry;
  float rx;
  Vec3 *coord_local;
  CubeFace face_local;
  
  fVar1 = Vector<float,_3>::x(coord);
  fVar2 = Vector<float,_3>::y(coord);
  fVar3 = Vector<float,_3>::z(coord);
  ma = 0.0;
  s = 0.0;
  t = 0.0;
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    s = -fVar2;
    t = -fVar1;
    ma = fVar3;
    break;
  case CUBEFACE_POSITIVE_X:
    s = -fVar2;
    t = fVar1;
    ma = -fVar3;
    break;
  case CUBEFACE_NEGATIVE_Y:
    s = -fVar3;
    t = -fVar2;
    ma = fVar1;
    break;
  case CUBEFACE_POSITIVE_Y:
    t = fVar2;
    s = fVar3;
    ma = fVar1;
    break;
  case CUBEFACE_NEGATIVE_Z:
    t = -fVar3;
    s = -fVar2;
    ma = -fVar1;
    break;
  case CUBEFACE_POSITIVE_Z:
    t = fVar3;
    s = -fVar2;
    ma = fVar1;
  }
  Vector<float,_2>::Vector((Vector<float,_2> *)this,(ma / t + 1.0) / 2.0,(s / t + 1.0) / 2.0);
  VVar4.m_data[0] = extraout_XMM0_Qa[0];
  VVar4.m_data[1] = extraout_XMM0_Qa[1];
  return (Vec2)VVar4.m_data;
}

Assistant:

Vec2 projectToFace (CubeFace face, const Vec3& coord)
{
	const float	rx		= coord.x();
	const float	ry		= coord.y();
	const float	rz		= coord.z();
	float		sc		= 0.0f;
	float		tc		= 0.0f;
	float		ma		= 0.0f;
	float		s;
	float		t;

	switch (face)
	{
		case CUBEFACE_NEGATIVE_X: sc = +rz; tc = -ry; ma = -rx; break;
		case CUBEFACE_POSITIVE_X: sc = -rz; tc = -ry; ma = +rx; break;
		case CUBEFACE_NEGATIVE_Y: sc = +rx; tc = -rz; ma = -ry; break;
		case CUBEFACE_POSITIVE_Y: sc = +rx; tc = +rz; ma = +ry; break;
		case CUBEFACE_NEGATIVE_Z: sc = -rx; tc = -ry; ma = -rz; break;
		case CUBEFACE_POSITIVE_Z: sc = +rx; tc = -ry; ma = +rz; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	// Compute s, t
	s = ((sc / ma) + 1.0f) / 2.0f;
	t = ((tc / ma) + 1.0f) / 2.0f;

	return Vec2(s, t);
}